

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,Molecule *mol,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  SnapshotManager *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Atom *atom;
  SelectionEvaluator *this_00;
  pointer ppAVar3;
  double dVar4;
  RealType RVar5;
  _Alloc_hider _Var6;
  Vector3d pos;
  Vector<double,_3U> local_78;
  _Alloc_hider local_60;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  _Alloc_hider _Stack_40;
  
  this_00 = (SelectionEvaluator *)&stack0xffffffffffffffa0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)this_00);
  switch(property) {
  case 0x1c00:
    local_50 = Molecule::getMass(mol);
    break;
  case 0x1c01:
    ppAVar3 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_50 = (pointer)0x0;
    _Var6._M_p = (pointer)0x0;
    if (ppAVar3 !=
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001c0f00;
    atom = (Atom *)0x0;
    while (atom != (Atom *)0x0) {
      local_48 = local_50;
      _Stack_40._M_p = _Var6._M_p;
      RVar5 = getCharge(this_00,atom,frame);
      local_50 = (double)local_48 + RVar5;
      ppAVar3 = ppAVar3 + 1;
      atom = (Atom *)0x0;
      _Var6._M_p = _Stack_40._M_p;
      if (ppAVar3 !=
          (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001c0f00:
        atom = *ppAVar3;
      }
    }
    break;
  case 0x1c02:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    local_50 = local_78.data_[0];
    break;
  case 0x1c03:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    local_50 = local_78.data_[1];
    break;
  case 0x1c04:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    local_50 = local_78.data_[2];
    break;
  case 0x1c05:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    local_50 = Vector<double,_3U>::length(&local_78);
    break;
  case 0x1c06:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    Vector<double,_3U>::operator=((Vector<double,_3U> *)&stack0xffffffffffffffa0,&local_78);
    pSVar1 = this->info->sman_;
    iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
    Snapshot::wrapVector
              ((Snapshot *)CONCAT44(extraout_var_00,iVar2),(Vector3d *)&stack0xffffffffffffffa0);
    local_50 = local_60._M_p;
    break;
  case 0x1c07:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    Vector<double,_3U>::operator=((Vector<double,_3U> *)&stack0xffffffffffffffa0,&local_78);
    pSVar1 = this->info->sman_;
    iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
    Snapshot::wrapVector
              ((Snapshot *)CONCAT44(extraout_var,iVar2),(Vector3d *)&stack0xffffffffffffffa0);
    local_50 = local_58;
    break;
  case 0x1c08:
    Molecule::getCom((Vector3d *)&local_78,mol,frame);
    Vector<double,_3U>::operator=((Vector<double,_3U> *)&stack0xffffffffffffffa0,&local_78);
    pSVar1 = this->info->sman_;
    iVar2 = (*pSVar1->_vptr_SnapshotManager[4])(pSVar1,(ulong)(uint)frame);
    Snapshot::wrapVector
              ((Snapshot *)CONCAT44(extraout_var_01,iVar2),(Vector3d *)&stack0xffffffffffffffa0);
    break;
  default:
    unrecognizedMoleculeProperty(this,property);
    local_50 = (pointer)0x0;
  }
  switch(comparator) {
  case 0x3400:
    if ((double)local_50 <= (double)comparisonValue) {
      return;
    }
    break;
  case 0x3401:
    if ((double)local_50 < (double)comparisonValue) {
      return;
    }
    break;
  case 0x3402:
    dVar4 = (double)comparisonValue;
    goto LAB_001c0eae;
  case 0x3403:
    if ((double)comparisonValue <= (double)local_50) {
      return;
    }
    break;
  case 0x3404:
    local_50 = ABS((double)local_50 - (double)comparisonValue);
    dVar4 = 1e-06;
LAB_001c0eae:
    if (dVar4 < (double)local_50) {
      return;
    }
    break;
  case 0x3405:
    if (((double)local_50 == (double)comparisonValue) &&
       (!NAN((double)local_50) && !NAN((double)comparisonValue))) {
      return;
    }
    break;
  default:
    goto switchD_001c0e7c_default;
  }
  OpenMDBitSet::setBitOn
            ((bs->bitsets_).
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start + 5,(long)mol->globalIndex_);
switchD_001c0e7c_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(Molecule* mol, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::mass:
      propertyValue = mol->getMass();
      break;
    case Token::charge: {
      Molecule::AtomIterator ai;
      Atom* atom;
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        propertyValue += getCharge(atom, frame);
      }
    } break;
    case Token::x:
      propertyValue = mol->getCom(frame).x();
      break;
    case Token::y:
      propertyValue = mol->getCom(frame).y();
      break;
    case Token::z:
      propertyValue = mol->getCom(frame).z();
      break;
    case Token::wrappedX:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = mol->getCom(frame).length();
      break;
    default:
      unrecognizedMoleculeProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
  }